

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManRefinePrintPPis(Ga2_Man_t *p)

{
  int Entry;
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  pVVar5 = p->vValues;
  if (pVVar5->nSize < 1) {
    uVar2 = 0;
  }
  else {
    lVar8 = 0;
    do {
      Entry = pVVar5->pArray[lVar8];
      lVar7 = (long)Entry;
      if ((lVar7 < 0) || (p->pGia->nObjs <= Entry)) goto LAB_006023e3;
      pGVar1 = p->pGia->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (lVar8 != 0) {
        if (p->vIds->nSize <= Entry) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pGVar1 = pGVar1 + lVar7;
        uVar2 = p->vIds->pArray[lVar7];
        if ((int)uVar2 < 0) {
          if (*(long *)pGVar1 < 0) {
            __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x4d2,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
          }
LAB_00602427:
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x4d1,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
        }
        if (p->vCnfs->nSize <= (int)(uVar2 * 2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (p->vCnfs->pArray[(ulong)uVar2 * 2] == (void *)0x0) {
          lVar7 = *(long *)pGVar1;
          if (-1 < lVar7) goto LAB_00602427;
          uVar2 = (uint)lVar7;
          uVar3 = ~uVar2;
          if (((uVar3 & 0x9fffffff) != 0) && ((int)uVar2 < 0 || (uVar3 & 0x1fffffff) == 0)) {
            __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x4d3,"void Ga2_ManRefinePrintPPis(Ga2_Man_t *)");
          }
          Vec_IntPush(p_00,Entry);
          pVVar5 = p->vValues;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar5->nSize);
    uVar2 = p_00->nSize;
  }
  printf("        Current PPIs (%d): ",(ulong)uVar2);
  piVar4 = p_00->pArray;
  qsort(piVar4,(long)(int)uVar2,4,Vec_IntSortCompare2);
  if ((int)uVar2 < 1) {
    putchar(10);
    if (piVar4 == (int *)0x0) goto LAB_006023cd;
  }
  else {
    uVar6 = 0;
    do {
      if ((piVar4[uVar6] < 0) || (p->pGia->nObjs <= piVar4[uVar6])) {
LAB_006023e3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) break;
      printf("%d ");
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
    putchar(10);
  }
  free(piVar4);
LAB_006023cd:
  free(p_00);
  return;
}

Assistant:

void Ga2_ManRefinePrintPPis( Ga2_Man_t * p )
{
    Vec_Int_t * vVec = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vVec, Gia_ObjId(p->pGia, pObj) );
    }
    printf( "        Current PPIs (%d): ", Vec_IntSize(vVec) );
    Vec_IntSort( vVec, 1 );
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        printf( "%d ", Gia_ObjId(p->pGia, pObj) );
    printf( "\n" );
    Vec_IntFree( vVec );
}